

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall
leveldb::VersionSet::VersionSet
          (VersionSet *this,string *dbname,Options *options,TableCache *table_cache,
          InternalKeyComparator *cmp)

{
  long lVar1;
  Version *this_00;
  undefined8 in_RCX;
  long in_RDX;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  Version *in_stack_ffffffffffffff60;
  VersionSet *in_stack_ffffffffffffff68;
  VersionSet *in_stack_ffffffffffffff70;
  Version *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  undefined8 *puVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = *(undefined8 *)(in_RDX + 0x10);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 1),
             in_stack_ffffffffffffff98);
  in_RDI[5] = in_RDX;
  in_RDI[6] = in_RCX;
  InternalKeyComparator::InternalKeyComparator
            ((InternalKeyComparator *)in_stack_ffffffffffffff68,
             (InternalKeyComparator *)in_stack_ffffffffffffff60);
  in_RDI[9] = 2;
  in_RDI[10] = 0;
  in_RDI[0xb] = 0;
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  Version::Version(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  in_RDI[0x2d] = 0;
  puVar2 = in_RDI + 0x2e;
  do {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff70);
    puVar2 = puVar2 + 4;
  } while (puVar2 != in_RDI + 0x4a);
  this_00 = (Version *)operator_new(0xe8);
  Version::Version(this_00,in_stack_ffffffffffffff70);
  AppendVersion(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

VersionSet::VersionSet(const std::string& dbname, const Options* options,
                       TableCache* table_cache,
                       const InternalKeyComparator* cmp)
    : env_(options->env),
      dbname_(dbname),
      options_(options),
      table_cache_(table_cache),
      icmp_(*cmp),
      next_file_number_(2),
      manifest_file_number_(0),  // Filled by Recover()
      last_sequence_(0),
      log_number_(0),
      prev_log_number_(0),
      descriptor_file_(nullptr),
      descriptor_log_(nullptr),
      dummy_versions_(this),
      current_(nullptr) {
  AppendVersion(new Version(this));
}